

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

void sort_data_ensure_sz(stagewise_poly *poly,size_t len)

{
  ulong uVar1;
  sort_data *psVar2;
  
  if (poly->sd_len < len) {
    uVar1 = 1L << ((byte)poly->all->num_bits & 0x3f);
    if (len * 2 < uVar1) {
      uVar1 = len * 2;
    }
    poly->sd_len = uVar1;
    free(poly->sd);
    psVar2 = calloc_or_throw<sort_data>(poly->sd_len);
    poly->sd = psVar2;
  }
  return;
}

Assistant:

void sort_data_ensure_sz(stagewise_poly &poly, size_t len)
{
  if (poly.sd_len < len)
  {
    size_t len_candidate = 2 * len;
#ifdef DEBUG
    cout << "resizing sort buffer; current size " << poly.sd_len;
#endif  // DEBUG
    poly.sd_len = (len_candidate > poly.all->length()) ? poly.all->length() : len_candidate;
#ifdef DEBUG
    cout << ", new size " << poly.sd_len << endl;
#endif              // DEBUG
    free(poly.sd);  // okay for null.
    poly.sd = calloc_or_throw<sort_data>(poly.sd_len);
  }
  assert(len <= poly.sd_len);
}